

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

string * tinygltf::MimeToExt(string *__return_storage_ptr__,string *mimeType)

{
  bool bVar1;
  allocator local_30;
  allocator local_2f;
  allocator local_2e;
  allocator local_2d [20];
  allocator local_19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *mimeType_local;
  
  local_18 = mimeType;
  mimeType_local = __return_storage_ptr__;
  bVar1 = std::operator==(mimeType,"image/jpeg");
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"jpg",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  else {
    bVar1 = std::operator==(local_18,"image/png");
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"png",local_2d);
      std::allocator<char>::~allocator((allocator<char> *)local_2d);
    }
    else {
      bVar1 = std::operator==(local_18,"image/bmp");
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)__return_storage_ptr__,"bmp",&local_2e);
        std::allocator<char>::~allocator((allocator<char> *)&local_2e);
      }
      else {
        bVar1 = std::operator==(local_18,"image/gif");
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)__return_storage_ptr__,"gif",&local_2f);
          std::allocator<char>::~allocator((allocator<char> *)&local_2f);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_30);
          std::allocator<char>::~allocator((allocator<char> *)&local_30);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string MimeToExt(const std::string &mimeType) {
  if (mimeType == "image/jpeg") {
    return "jpg";
  } else if (mimeType == "image/png") {
    return "png";
  } else if (mimeType == "image/bmp") {
    return "bmp";
  } else if (mimeType == "image/gif") {
    return "gif";
  }

  return "";
}